

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O2

float parseFloat(char *p,char **end,char *endLine)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  byte *pbVar9;
  bool bVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  
  pcVar5 = p;
  if (*p == '\0') {
    *end = p;
    fVar13 = 0.0;
  }
  else {
    do {
      cVar3 = *pcVar5;
      bVar10 = pcVar5 < endLine;
      pcVar5 = pcVar5 + 1;
      if (cVar3 != ' ') break;
    } while (endLine == (char *)0x0 || bVar10);
    fVar13 = 0.0;
    for (pbVar9 = (byte *)(pcVar5 + ((ulong)(cVar3 == '-') - 1));
        (bVar7 = *pbVar9, endLine == (char *)0x0 || pbVar9 < endLine && ((byte)(bVar7 - 0x30) < 10))
        ; pbVar9 = pbVar9 + 1) {
      fVar13 = fVar13 * 10.0 + (float)(int)(char)bVar7 + -48.0;
    }
    uVar4 = 0;
    if (bVar7 == 0x2e) {
      while( true ) {
        pbVar9 = pbVar9 + 1;
        bVar7 = *pbVar9;
        if ((endLine != (char *)0x0 && endLine <= pbVar9) || (9 < (byte)(bVar7 - 0x30))) break;
        if (uVar4 < 0x23) {
          fVar13 = fVar13 * 10.0 + (float)(int)(char)(bVar7 - 0x30);
          uVar4 = uVar4 + 1;
        }
      }
    }
    iVar6 = 0;
    if (((bVar7 | 0x20) == 0x65) && ((endLine == (char *)0x0 || (pbVar9 < endLine)))) {
      pbVar1 = pbVar9 + 1;
      pbVar2 = pbVar9 + 1;
      pbVar9 = pbVar9 + 2;
      if (endLine <= pbVar1 && endLine != (char *)0x0 || *pbVar2 != 0x2d) {
        pbVar9 = pbVar1;
      }
      iVar8 = 0;
      for (; (bVar7 = *pbVar9, endLine == (char *)0x0 || pbVar9 < endLine &&
             ((byte)(bVar7 - 0x30) < 10)); pbVar9 = pbVar9 + 1) {
        iVar8 = iVar8 * 10 + (uint)bVar7 + -0x30;
      }
      iVar6 = -iVar8;
      if (endLine <= pbVar1 && endLine != (char *)0x0 || *pbVar2 != 0x2d) {
        iVar6 = iVar8;
      }
    }
    if (((bVar7 < 0x21) && ((0x100000600U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) ||
       (pbVar9 == (byte *)endLine)) {
      fVar11 = powf(10.0,(float)(int)(iVar6 - uVar4));
      fVar13 = fVar13 * fVar11;
      *end = (char *)pbVar9;
      if (cVar3 == '-') {
        fVar13 = -fVar13;
      }
    }
    else {
      dVar12 = strtod(p,end);
      fVar13 = (float)dVar12;
    }
  }
  return fVar13;
}

Assistant:

inline float parseFloat(char* p, char** end, char* endLine = nullptr)
{
  char* start = p;
  bool endLine_is_null = endLine == nullptr;

  if (!*p)
  {
    *end = p;
    return 0;
  }
  int s = 1;
  while ((*p == ' ') && (endLine_is_null || p < endLine)) p++;

  if (*p == '-')
  {
    s = -1;
    p++;
  }

  float acc = 0;
  while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) acc = acc * 10 + *p++ - '0';

  int num_dec = 0;
  if (*p == '.')
  {
    while (*(++p) >= '0' && *p <= '9' && (endLine_is_null || p < endLine))
    {
      if (num_dec < 35)
      {
        acc = acc * 10 + (*p - '0');
        num_dec++;
      }
    }
  }

  int exp_acc = 0;
  if ((*p == 'e' || *p == 'E') && (endLine_is_null || p < endLine))
  {
    p++;
    int exp_s = 1;
    if (*p == '-' && (endLine_is_null || p < endLine))
    {
      exp_s = -1;
      p++;
    }
    while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) exp_acc = exp_acc * 10 + *p++ - '0';
    exp_acc *= exp_s;
  }
  if (*p == ' ' || *p == '\n' || *p == '\t' || p == endLine)  // easy case succeeded.
  {
    acc *= powf(10, (float)(exp_acc - num_dec));
    *end = p;
    return s * acc;
  }
  else
    return (float)strtod(start, end);
}